

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O1

TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
* __thiscall
density::
sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
::reentrant_consume_operation::complete_type(reentrant_consume_operation *this)

{
  uintptr_t uint_pointer;
  
  if (*(ulong *)(this + 0x10) < 0x10) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/sp_heter_queue.h"
               ,0xa91);
  }
  return (TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
          *)(*(long *)(this + 8) + 8);
}

Assistant:

const RUNTIME_TYPE & complete_type() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return *Base::type_after_control(m_consume_data.m_control);
            }